

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

tdefl_status
tdefl_init(tdefl_compressor *d,tdefl_put_buf_func_ptr pPut_buf_func,void *pPut_buf_user,int flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  
  d->m_pPut_buf_func = pPut_buf_func;
  d->m_pPut_buf_user = pPut_buf_user;
  d->m_flags = flags;
  d->m_max_probes[0] = ((flags & 0xfffU) + 2) / 3 + 1;
  d->m_greedy_parsing = (uint)flags >> 0xe & 1;
  d->m_max_probes[1] = (((flags & 0xfffU) >> 2) + 2) / 3 + 1;
  if (-1 < (short)flags) {
    memset(d->m_hash,0,0x10000);
  }
  auVar1 = vpbroadcastq_avx512vl();
  auVar1 = vpaddq_avx2(auVar1,_DAT_0015f520);
  d->m_total_lz_bytes = 0;
  d->m_lz_code_buf_dict_pos = 0;
  d->m_bits_in = 0;
  d->m_bit_buffer = 0;
  d->m_output_flush_ofs = 0;
  d->m_output_flush_remaining = 0;
  d->m_finished = 0;
  d->m_block_index = 0;
  d->m_wants_to_finish = 0;
  d->m_prev_return_status = TDEFL_STATUS_OKAY;
  d->m_num_flags_left = 8;
  d->m_pLZ_code_buf = (mz_uint8 *)auVar1._0_8_;
  d->m_pLZ_flags = (mz_uint8 *)auVar1._8_8_;
  d->m_pOutput_buf = (mz_uint8 *)auVar1._16_8_;
  d->m_pOutput_buf_end = (mz_uint8 *)auVar1._24_8_;
  d->m_saved_lit = 0;
  d->m_saved_match_dist = 0;
  d->m_saved_match_len = 0;
  auVar2 = SUB6416(ZEXT464(1),0);
  d->m_adler32 = auVar2._0_4_;
  d->m_lookahead_pos = auVar2._4_4_;
  d->m_lookahead_size = auVar2._8_4_;
  d->m_dict_size = auVar2._12_4_;
  d->m_pIn_buf = (void *)0x0;
  d->m_pOut_buf = (void *)0x0;
  d->m_pIn_buf_size = (size_t *)0x0;
  d->m_pOut_buf_size = (size_t *)0x0;
  d->m_flush = TDEFL_NO_FLUSH;
  d->m_pSrc = (mz_uint8 *)0x0;
  d->m_src_buf_left = 0;
  d->m_out_buf_ofs = 0;
  if (-1 < (short)flags) {
    memset(d->m_dict,0,0x8101);
  }
  memset(d->m_huff_count,0,0x280);
  return TDEFL_STATUS_OKAY;
}

Assistant:

inline tdefl_status tdefl_init(tdefl_compressor* d, tdefl_put_buf_func_ptr pPut_buf_func, void* pPut_buf_user,
                               int flags) {

    d->m_pPut_buf_func = pPut_buf_func;
    d->m_pPut_buf_user = pPut_buf_user;
    d->m_flags = (mz_uint)(flags);
    d->m_max_probes[0] = 1 + ((flags & 0xFFF) + 2) / 3;
    d->m_greedy_parsing = (flags & TDEFL_GREEDY_PARSING_FLAG) != 0;
    d->m_max_probes[1] = 1 + (((flags & 0xFFF) >> 2) + 2) / 3;
    if (!(flags & TDEFL_NONDETERMINISTIC_PARSING_FLAG))
        MZ_CLEAR_OBJ(d->m_hash);
    d->m_lookahead_pos = d->m_lookahead_size = d->m_dict_size = d->m_total_lz_bytes = d->m_lz_code_buf_dict_pos = d
            ->m_bits_in = 0;
    d->m_output_flush_ofs = d->m_output_flush_remaining = d->m_finished = d->m_block_index = d->m_bit_buffer = d
            ->m_wants_to_finish = 0;
    d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
    d->m_pLZ_flags = d->m_lz_code_buf;
    d->m_num_flags_left = 8;
    d->m_pOutput_buf = d->m_output_buf;
    d->m_pOutput_buf_end = d->m_output_buf;
    d->m_prev_return_status = TDEFL_STATUS_OKAY;
    d->m_saved_match_dist = d->m_saved_match_len = d->m_saved_lit = 0;
    d->m_adler32 = 1;
    d->m_pIn_buf = NULL;
    d->m_pOut_buf = NULL;
    d->m_pIn_buf_size = NULL;
    d->m_pOut_buf_size = NULL;
    d->m_flush = TDEFL_NO_FLUSH;
    d->m_pSrc = NULL;
    d->m_src_buf_left = 0;
    d->m_out_buf_ofs = 0;
    if (!(flags & TDEFL_NONDETERMINISTIC_PARSING_FLAG))
        MZ_CLEAR_OBJ(d->m_dict);
    memset(&d->m_huff_count[0][0], 0, sizeof(d->m_huff_count[0][0]) * TDEFL_MAX_HUFF_SYMBOLS_0);
    memset(&d->m_huff_count[1][0], 0, sizeof(d->m_huff_count[1][0]) * TDEFL_MAX_HUFF_SYMBOLS_1);
    return TDEFL_STATUS_OKAY;
}